

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void mi_arenas_try_purge(_Bool force,_Bool visit_all)

{
  mi_arena_t *arena;
  size_t sVar1;
  _Bool _Var2;
  long lVar3;
  long lVar4;
  mi_msecs_t mVar5;
  size_t sVar6;
  ulong bitmap_idx;
  mi_msecs_t mVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  size_t count;
  ulong uVar16;
  bool bVar17;
  ulong local_70;
  
  _Var2 = _mi_preloading();
  if (!_Var2) {
    lVar3 = mi_option_get(mi_option_purge_delay);
    lVar4 = mi_option_get(mi_option_arena_purge_mult);
    if ((0 < lVar4 * lVar3) &&
       (((mVar5 = _mi_clock_now(), sVar1 = mi_arena_count, force ||
         (mVar5 <= mi_arenas_purge_expire && mi_arenas_purge_expire != 0)) && (mi_arena_count != 0))
       )) {
      LOCK();
      bVar17 = mi_arenas_try_purge::purge_guard == 0;
      if (bVar17) {
        mi_arenas_try_purge::purge_guard = 1;
      }
      UNLOCK();
      if (bVar17) {
        local_70 = 2;
        if (visit_all) {
          local_70 = mi_arena_count;
        }
        lVar3 = mi_option_get(mi_option_purge_delay);
        lVar4 = mi_option_get(mi_option_arena_purge_mult);
        mi_arenas_purge_expire = lVar4 * lVar3 + mVar5;
        sVar12 = 0;
LAB_0091e18c:
        arena = mi_arenas[sVar12];
        if (((arena != (mi_arena_t *)0x0) && ((arena->memid).is_pinned == false)) &&
           ((lVar3 = arena->purge_expire, force || (lVar3 <= mVar5 && lVar3 != 0)))) {
          LOCK();
          if (lVar3 == arena->purge_expire) {
            arena->purge_expire = 0;
          }
          UNLOCK();
          _mi_stat_counter_increase(&_mi_stats_main.arena_purges,1);
          sVar6 = arena->field_count;
          if (sVar6 != 0) {
            bVar17 = true;
            bVar15 = false;
            uVar9 = 0;
LAB_0091e20b:
            uVar10 = arena->blocks_purge[uVar9];
            if (uVar10 != 0) {
              uVar14 = 0;
LAB_0091e230:
              sVar6 = 0x40 - uVar14;
              sVar11 = 0;
              do {
                if ((uVar10 >> ((ulong)(uint)((int)uVar14 + (int)sVar11) & 0x3f) & 1) == 0) {
                  sVar6 = sVar11;
                  if (sVar11 == 0) goto LAB_0091e28d;
                  break;
                }
                lVar3 = sVar11 + 1;
                sVar11 = sVar11 + 1;
              } while (lVar3 + uVar14 != 0x40);
              bitmap_idx = uVar14 | uVar9 * 0x40;
LAB_0091e270:
              _Var2 = _mi_bitmap_try_claim(arena->blocks_inuse,arena->field_count,sVar6,bitmap_idx);
              if (!_Var2) goto code_r0x0091e288;
              uVar10 = arena->blocks_purge[uVar9];
              uVar13 = uVar14 + sVar6;
              if (uVar14 < uVar13) {
                bVar8 = 0;
                uVar16 = uVar14;
                do {
                  sVar11 = 0;
                  do {
                    if ((uVar10 >> ((ulong)(uint)((int)uVar16 + (int)sVar11) & 0x3f) & 1) == 0)
                    break;
                    lVar3 = uVar16 + sVar11;
                    sVar11 = sVar11 + 1;
                  } while (lVar3 + 1U < uVar13);
                  if (sVar11 != 0) {
                    mi_arena_purge(arena,uVar16 + uVar9 * 0x40,sVar11);
                    bVar8 = bVar8 | sVar11 == sVar6;
                  }
                  uVar16 = uVar16 + sVar11 + 1;
                } while (uVar16 < uVar13);
                bVar17 = (bool)(bVar8 & bVar17);
              }
              else {
                bVar17 = false;
              }
              _mi_bitmap_unclaim(arena->blocks_inuse,arena->field_count,sVar6,bitmap_idx);
              bVar15 = true;
              goto LAB_0091e343;
            }
            goto LAB_0091e35c;
          }
        }
        goto LAB_0091e3f8;
      }
    }
  }
  return;
code_r0x0091e288:
  sVar6 = sVar6 - 1;
  if (sVar6 == 0) goto LAB_0091e28d;
  goto LAB_0091e270;
LAB_0091e28d:
  sVar6 = 0;
LAB_0091e343:
  uVar14 = uVar14 + sVar6 + 1;
  if (0x3f < uVar14) goto code_r0x0091e353;
  goto LAB_0091e230;
code_r0x0091e353:
  sVar6 = arena->field_count;
LAB_0091e35c:
  uVar9 = uVar9 + 1;
  if (sVar6 <= uVar9) goto code_r0x0091e368;
  goto LAB_0091e20b;
code_r0x0091e368:
  if (!bVar17) {
    lVar3 = mi_option_get(mi_option_purge_delay);
    lVar4 = mi_option_get(mi_option_arena_purge_mult);
    mVar7 = _mi_clock_now();
    LOCK();
    if (arena->purge_expire == 0) {
      arena->purge_expire = mVar7 + lVar4 * lVar3;
    }
    UNLOCK();
  }
  if (bVar15) {
    if (local_70 < 2) {
      mi_arenas_try_purge::purge_guard = 0;
      return;
    }
    local_70 = local_70 - 1;
  }
LAB_0091e3f8:
  sVar12 = sVar12 + 1;
  if (sVar12 == sVar1) {
    mi_arenas_purge_expire = 0;
    mi_arenas_try_purge::purge_guard = 0;
    return;
  }
  goto LAB_0091e18c;
}

Assistant:

static void mi_arenas_try_purge( bool force, bool visit_all ) 
{
  if (_mi_preloading() || mi_arena_purge_delay() <= 0) return;  // nothing will be scheduled

  // check if any arena needs purging?
  const mi_msecs_t now = _mi_clock_now();
  mi_msecs_t arenas_expire = mi_atomic_loadi64_acquire(&mi_arenas_purge_expire);
  if (!force && (arenas_expire == 0 || arenas_expire < now)) return;

  const size_t max_arena = mi_atomic_load_acquire(&mi_arena_count);
  if (max_arena == 0) return;

  // allow only one thread to purge at a time
  static mi_atomic_guard_t purge_guard;
  mi_atomic_guard(&purge_guard)
  {
    // increase global expire: at most one purge per delay cycle
    mi_atomic_storei64_release(&mi_arenas_purge_expire, now + mi_arena_purge_delay());  
    size_t max_purge_count = (visit_all ? max_arena : 2);
    bool all_visited = true;
    for (size_t i = 0; i < max_arena; i++) {
      mi_arena_t* arena = mi_atomic_load_ptr_acquire(mi_arena_t, &mi_arenas[i]);
      if (arena != NULL) {
        if (mi_arena_try_purge(arena, now, force)) {
          if (max_purge_count <= 1) {
            all_visited = false;
            break;
          }
          max_purge_count--;
        }
      }
    }
    if (all_visited) {
      // all arena's were visited and purged: reset global expire
      mi_atomic_storei64_release(&mi_arenas_purge_expire, 0);
    }
  }
}